

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O3

void __thiscall TadsMessageQueue::TadsMessageQueue(TadsMessageQueue *this,OS_Event *quit_evt)

{
  OS_Counter *pOVar1;
  OS_Mutex *pOVar2;
  OS_Event *pOVar3;
  
  (this->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsMessageQueue_0034ac98;
  pOVar2 = (OS_Mutex *)operator_new(0x38);
  (pOVar2->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (pOVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__OS_Mutex_0034aa20;
  pthread_mutex_init((pthread_mutex_t *)&pOVar2->h,(pthread_mutexattr_t *)0x0);
  this->mu = pOVar2;
  pOVar3 = (OS_Event *)operator_new(0x88);
  (pOVar3->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (pOVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__OS_Event_0034aac8;
  (pOVar3->super_OS_Waitable)._vptr_OS_Waitable = (_func_int **)&PTR__OS_Event_0034aaf0;
  pOVar3->manual_reset = 0;
  pOVar3->cnt = 0;
  pthread_cond_init((pthread_cond_t *)&pOVar3->cond,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&pOVar3->mutex,(pthread_mutexattr_t *)0x0);
  pOVar3->sub_head = (osu_waitsub *)0x0;
  pOVar3->sub_tail = (osu_waitsub *)0x0;
  this->ev = pOVar3;
  this->head = (TadsMessage *)0x0;
  this->tail = (TadsMessage *)0x0;
  this->quit_evt = quit_evt;
  if (quit_evt != (OS_Event *)0x0) {
    LOCK();
    pOVar1 = &(quit_evt->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

TadsMessageQueue(OS_Event *quit_evt)
    {
        /* create our mutex object */
        mu = new OS_Mutex();

        /* create our event - this signals when a message arrives */
        ev = new OS_Event(FALSE);

        /* no messages in the queue yet */
        head = tail = 0;

        /* remember my global quit event */
        if ((this->quit_evt = quit_evt) != 0)
            quit_evt->add_ref();
    }